

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Status __thiscall
leveldb::Table::InternalGet
          (Table *this,ReadOptions *options,Slice *k,void *arg,
          _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Iterator *arg_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 in_RCX;
  ReadOptions *extraout_RDX;
  long *in_RSI;
  Block *in_RDI;
  undefined8 in_R8;
  code *in_R9;
  Iterator *block_iter;
  BlockHandle handle;
  FilterBlockReader *filter;
  Slice handle_value;
  Iterator *iiter;
  Status *s;
  Status *in_stack_fffffffffffffee8;
  Iterator *in_stack_fffffffffffffef0;
  Slice *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  FilterBlockReader *this_00;
  uint7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar4;
  Block *this_01;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined8 local_b0 [2];
  undefined8 local_a0 [2];
  undefined8 local_90;
  Iterator *local_80;
  byte local_71;
  Status local_70;
  BlockHandle local_68;
  FilterBlockReader *local_58;
  ReadOptions *options_00;
  Slice *index_value;
  
  this_01 = in_RDI;
  Status::Status((Status *)in_RDI);
  arg_00 = Block::NewIterator(this_01,(Comparator *)
                                      CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20))
  ;
  (*arg_00->_vptr_Iterator[5])(arg_00,in_RCX);
  uVar2 = (*arg_00->_vptr_Iterator[2])();
  if ((uVar2 & 1) != 0) {
    iVar3 = (*arg_00->_vptr_Iterator[9])();
    index_value = (Slice *)CONCAT44(extraout_var,iVar3);
    local_58 = *(FilterBlockReader **)(*in_RSI + 0x878);
    options_00 = extraout_RDX;
    BlockHandle::BlockHandle(&local_68);
    local_71 = 0;
    bVar4 = 0;
    if (local_58 != (FilterBlockReader *)0x0) {
      BlockHandle::DecodeFrom((BlockHandle *)this_01,(Slice *)(ulong)in_stack_ffffffffffffff20);
      local_71 = 1;
      bVar1 = Status::ok(&local_70);
      bVar4 = 0;
      if (bVar1) {
        this_00 = local_58;
        BlockHandle::offset(&local_68);
        bVar1 = FilterBlockReader::KeyMayMatch
                          (this_00,CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08);
        bVar4 = bVar1 ^ 0xff;
      }
    }
    if ((local_71 & 1) != 0) {
      Status::~Status((Status *)in_stack_fffffffffffffef0);
    }
    if ((bVar4 & 1) == 0) {
      iVar3 = (*arg_00->_vptr_Iterator[9])();
      local_90 = CONCAT44(extraout_var_00,iVar3);
      local_80 = BlockReader(arg_00,options_00,index_value);
      (*local_80->_vptr_Iterator[5])(local_80,in_RCX);
      uVar2 = (*local_80->_vptr_Iterator[2])();
      if ((uVar2 & 1) != 0) {
        iVar3 = (*local_80->_vptr_Iterator[8])();
        local_a0[0] = CONCAT44(extraout_var_01,iVar3);
        iVar3 = (*local_80->_vptr_Iterator[9])();
        local_b0[0] = CONCAT44(extraout_var_02,iVar3);
        (*in_R9)(in_R8,local_a0,local_b0);
      }
      (*local_80->_vptr_Iterator[10])(local_b8);
      Status::operator=((Status *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      Status::~Status((Status *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffef0 = local_80;
      if (local_80 != (Iterator *)0x0) {
        (*local_80->_vptr_Iterator[1])();
      }
    }
  }
  bVar1 = Status::ok((Status *)this_01);
  if (bVar1) {
    (*arg_00->_vptr_Iterator[10])(local_c0);
    Status::operator=((Status *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    Status::~Status((Status *)in_stack_fffffffffffffef0);
  }
  if (arg_00 != (Iterator *)0x0) {
    (*arg_00->_vptr_Iterator[1])();
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status Table::InternalGet(const ReadOptions& options, const Slice& k, void* arg,
                          void (*handle_result)(void*, const Slice&,
                                                const Slice&)) {
  Status s;
  Iterator* iiter = rep_->index_block->NewIterator(rep_->options.comparator);
  iiter->Seek(k);
  if (iiter->Valid()) {
    Slice handle_value = iiter->value();
    FilterBlockReader* filter = rep_->filter;
    BlockHandle handle;
    if (filter != nullptr && handle.DecodeFrom(&handle_value).ok() &&
        !filter->KeyMayMatch(handle.offset(), k)) {
      // Not found
    } else {
      Iterator* block_iter = BlockReader(this, options, iiter->value());
      block_iter->Seek(k);
      if (block_iter->Valid()) {
        (*handle_result)(arg, block_iter->key(), block_iter->value());
      }
      s = block_iter->status();
      delete block_iter;
    }
  }
  if (s.ok()) {
    s = iiter->status();
  }
  delete iiter;
  return s;
}